

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

PerspectiveCameraData *
embree::SceneGraph::lerp
          (PerspectiveCameraData *__return_storage_ptr__,PerspectiveCameraData *a,
          PerspectiveCameraData *b,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  fVar25 = 1.0 - t;
  fVar3 = (b->from).field_0.m128[1];
  fVar4 = (b->from).field_0.m128[2];
  fVar5 = (b->from).field_0.m128[3];
  fVar6 = (a->from).field_0.m128[1];
  fVar7 = (a->from).field_0.m128[2];
  fVar8 = (a->from).field_0.m128[3];
  fVar9 = (b->to).field_0.m128[0];
  fVar10 = (b->to).field_0.m128[1];
  fVar11 = (b->to).field_0.m128[2];
  fVar12 = (b->to).field_0.m128[3];
  fVar13 = (a->to).field_0.m128[0];
  fVar14 = (a->to).field_0.m128[1];
  fVar15 = (a->to).field_0.m128[2];
  fVar16 = (a->to).field_0.m128[3];
  fVar17 = (b->up).field_0.m128[0];
  fVar18 = (b->up).field_0.m128[1];
  fVar19 = (b->up).field_0.m128[2];
  fVar20 = (b->up).field_0.m128[3];
  fVar21 = (a->up).field_0.m128[0];
  fVar22 = (a->up).field_0.m128[1];
  fVar23 = (a->up).field_0.m128[2];
  fVar24 = (a->up).field_0.m128[3];
  fVar1 = b->fov;
  fVar2 = a->fov;
  (__return_storage_ptr__->from).field_0.m128[0] =
       (a->from).field_0.m128[0] * fVar25 + (b->from).field_0.m128[0] * t;
  (__return_storage_ptr__->from).field_0.m128[1] = fVar6 * fVar25 + fVar3 * t;
  (__return_storage_ptr__->from).field_0.m128[2] = fVar7 * fVar25 + fVar4 * t;
  (__return_storage_ptr__->from).field_0.m128[3] = fVar8 * fVar25 + fVar5 * t;
  (__return_storage_ptr__->to).field_0.m128[0] = fVar13 * fVar25 + fVar9 * t;
  (__return_storage_ptr__->to).field_0.m128[1] = fVar14 * fVar25 + fVar10 * t;
  (__return_storage_ptr__->to).field_0.m128[2] = fVar15 * fVar25 + fVar11 * t;
  (__return_storage_ptr__->to).field_0.m128[3] = fVar16 * fVar25 + fVar12 * t;
  (__return_storage_ptr__->up).field_0.m128[0] = fVar25 * fVar21 + t * fVar17;
  (__return_storage_ptr__->up).field_0.m128[1] = fVar25 * fVar22 + t * fVar18;
  (__return_storage_ptr__->up).field_0.m128[2] = fVar25 * fVar23 + t * fVar19;
  (__return_storage_ptr__->up).field_0.m128[3] = fVar25 * fVar24 + t * fVar20;
  __return_storage_ptr__->fov = fVar25 * fVar2 + t * fVar1;
  return __return_storage_ptr__;
}

Assistant:

PerspectiveCameraData lerp(const PerspectiveCameraData& a, const PerspectiveCameraData& b, const float t)
      {
        const Vec3fa from = embree::lerp(a.from, b.from, t);
        const Vec3fa to   = embree::lerp(a.to  , b.to  , t);
        const Vec3fa up   = embree::lerp(a.up  , b.up  , t);
        const float  fov  = embree::lerp(a.fov , b.fov , t);
        return PerspectiveCameraData(from,to,up,fov);
      }